

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

bool __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::try_reentrant_pop(lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                    *this)

{
  bool bVar1;
  undefined1 local_30 [8];
  reentrant_consume_operation operation;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  *this_local;
  
  operation.m_consume_data.m_next_ptr = (uintptr_t)this;
  try_start_reentrant_consume((reentrant_consume_operation *)local_30,this);
  bVar1 = density::lf_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)local_30);
  if (bVar1) {
    reentrant_consume_operation::commit((reentrant_consume_operation *)local_30);
    this_local._7_1_ = 1;
  }
  reentrant_consume_operation::~reentrant_consume_operation((reentrant_consume_operation *)local_30)
  ;
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool try_reentrant_pop() noexcept
        {
            if (auto operation = try_start_reentrant_consume())
            {
                operation.commit();
                return true;
            }
            return false;
        }